

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Section::~Section(Section *this)

{
  double dVar1;
  char cVar2;
  IResultCapture *pIVar3;
  long lStack_a0;
  SectionEndInfo endInfo;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_001accb8;
  if (this->m_sectionIncluded == true) {
    dVar1 = Timer::getElapsedSeconds(&this->m_timer);
    SectionInfo::SectionInfo(&endInfo.sectionInfo,&this->m_info);
    endInfo.prevAssertions.failedButOk = (this->m_assertions).failedButOk;
    endInfo.prevAssertions.passed = (this->m_assertions).passed;
    endInfo.prevAssertions.failed = (this->m_assertions).failed;
    endInfo.durationInSeconds = dVar1;
    cVar2 = std::uncaught_exception();
    if (cVar2 == '\0') {
      pIVar3 = getResultCapture();
      lStack_a0 = 0x20;
    }
    else {
      pIVar3 = getResultCapture();
      lStack_a0 = 0x28;
    }
    (**(code **)((long)pIVar3->_vptr_IResultCapture + lStack_a0))(pIVar3,&endInfo);
    SectionInfo::~SectionInfo(&endInfo.sectionInfo);
  }
  std::__cxx11::string::~string((string *)&this->m_name);
  SectionInfo::~SectionInfo(&this->m_info);
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo( m_info, m_assertions, m_timer.getElapsedSeconds() );
            if( std::uncaught_exception() )
                getResultCapture().sectionEndedEarly( endInfo );
            else
                getResultCapture().sectionEnded( endInfo );
        }
    }